

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsFirstPartialDerivativeWRTControl
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *partialDerivative)

{
  _Base_ptr *vec;
  bool bVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  string *psVar7;
  _Rb_tree_header *p_Var8;
  bool bVar9;
  ostringstream errorMsg;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1e8;
  VectorDynSize *local_1c8;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1c0;
  undefined1 local_1a8 [40];
  long lStack_180;
  undefined1 local_178;
  
  local_1c8 = state;
  lVar3 = iDynTree::VectorDynSize::size();
  lVar4 = iDynTree::VectorDynSize::size();
  if (lVar3 != lVar4) {
    iDynTree::VectorDynSize::size();
    iDynTree::VectorDynSize::resize((ulong)partialDerivative);
  }
  p_Var5 = (this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header;
  bVar9 = true;
  do {
    if ((_Rb_tree_header *)p_Var5 == p_Var8) {
LAB_00180057:
      return (_Rb_tree_header *)p_Var5 == p_Var8;
    }
    bVar1 = TimeRange::isInRange((TimeRange *)&p_Var5[8]._M_left,time);
    if (bVar1) {
      vec = &p_Var5[7]._M_parent;
      cVar2 = (**(code **)(**(long **)(p_Var5 + 2) + 0x20))
                        (SUB84(time,0),*(long **)(p_Var5 + 2),local_1c8,control,vec);
      if (cVar2 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar6 = std::operator<<((ostream *)local_1a8,"Error while evaluating cost ");
        psVar7 = Cost::name_abi_cxx11_(*(Cost **)(p_Var5 + 2));
        poVar6 = std::operator<<(poVar6,(string *)psVar7);
        std::operator<<(poVar6,".");
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","costFirstPartialDerivativeWRTControl",
                   (char *)local_1e8._0_8_);
      }
      else {
        lVar3 = iDynTree::VectorDynSize::size();
        lVar4 = iDynTree::VectorDynSize::size();
        if (lVar3 == lVar4) {
          if (bVar9) {
            toEigen(&local_1e8,(VectorDynSize *)vec);
            local_1a8._24_8_ = p_Var5[8]._M_parent;
            local_1a8._8_8_ = local_1e8._8_8_;
            local_178 = local_1e8._16_1_;
            local_1a8._32_8_ = local_1e8._0_8_;
            lStack_180 = local_1e8._8_8_;
            toEigen(&local_1c0,partialDerivative);
            Eigen::internal::
            call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>const>>
                      (&local_1c0,
                       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)local_1a8);
          }
          else {
            toEigen(&local_1e8,(VectorDynSize *)vec);
            local_1a8._24_8_ = p_Var5[8]._M_parent;
            local_1a8._8_8_ = local_1e8._8_8_;
            local_178 = local_1e8._16_1_;
            local_1a8._32_8_ = local_1e8._0_8_;
            lStack_180 = local_1e8._8_8_;
            toEigen(&local_1c0,partialDerivative);
            Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
            operator+=((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                        *)&local_1c0,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                        *)local_1a8);
          }
          bVar9 = false;
          goto LAB_0017ff50;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar6 = std::operator<<((ostream *)local_1a8,"Error while evaluating ");
        psVar7 = Cost::name_abi_cxx11_(*(Cost **)(p_Var5 + 2));
        poVar6 = std::operator<<(poVar6,(string *)psVar7);
        poVar6 = std::operator<<(poVar6,": ");
        std::operator<<(poVar6,"the jacobian size is expected to match the control dimension.");
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","costFirstPartialDerivativeWRTControl",
                   (char *)local_1e8._0_8_);
      }
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      goto LAB_00180057;
    }
LAB_0017ff50:
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

bool OptimalControlProblem::costsFirstPartialDerivativeWRTControl(double time, const VectorDynSize &state, const VectorDynSize &control, VectorDynSize &partialDerivative)
        {
            if (partialDerivative.size() != control.size()) {
                partialDerivative.resize(control.size());
            }

            bool first = true;

            for(auto& cost : m_pimpl->costs){
                if (cost.second.timeRange.isInRange(time)){
                    if (!cost.second.cost->costFirstPartialDerivativeWRTControl(time, state, control, cost.second.controlJacobianBuffer)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost " << cost.second.cost->name() <<".";
                        reportError("OptimalControlProblem", "costFirstPartialDerivativeWRTControl", errorMsg.str().c_str());
                        return false;
                    }
                    if (cost.second.controlJacobianBuffer.size() != control.size()){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating " << cost.second.cost->name() <<": " << "the jacobian size is expected to match the control dimension.";
                        reportError("OptimalControlProblem", "costFirstPartialDerivativeWRTControl", errorMsg.str().c_str());
                        return false;
                    }
                    if (first){
                        toEigen(partialDerivative) = cost.second.weight * toEigen(cost.second.controlJacobianBuffer);
                        first = false;
                    } else {
                        toEigen(partialDerivative) += cost.second.weight * toEigen(cost.second.controlJacobianBuffer);
                    }
                }
            }
            return true;
        }